

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::handleDotSwizzle
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  TIntermediate *this_00;
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TBasicType TVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TQualifier *pTVar6;
  undefined4 extraout_var_04;
  long lVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar8;
  TType local_230;
  TIntermTyped *local_198;
  TIntermTyped *index_1;
  TIntermConstantUnion *local_f8;
  TIntermTyped *index;
  TType type;
  TSwizzleSelectors<int> selectors;
  char *dotFeature;
  TIntermTyped *result;
  TString *field_local;
  TIntermTyped *base_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  uVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2c])();
  if ((uVar3 & 1) != 0) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"scalar swizzle");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1a4,"GL_ARB_shading_language_420pack",
               "scalar swizzle");
  }
  TSwizzleSelectors<int>::TSwizzleSelectors((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
  uVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x26])();
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x44])
            (this,loc,field,(ulong)uVar3,(undefined1 *)((long)&type.spirvType + 4));
  uVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2b])();
  if (((uVar3 & 1) != 0) &&
     (iVar4 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4)),
     iVar4 != 1)) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::contains16BitFloat((TType *)CONCAT44(extraout_var,iVar4));
    if (bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                (this,loc,".");
    }
  }
  uVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2b])();
  if (((uVar3 & 1) != 0) &&
     (iVar4 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4)),
     iVar4 != 1)) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::contains16BitInt((TType *)CONCAT44(extraout_var_00,iVar4));
    if (bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                (this,loc,".");
    }
  }
  uVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2b])();
  if (((uVar3 & 1) != 0) &&
     (iVar4 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4)),
     iVar4 != 1)) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::contains8BitInt((TType *)CONCAT44(extraout_var_01,iVar4));
    if (bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                (this,loc,".");
    }
  }
  uVar3 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x2c])();
  if ((uVar3 & 1) == 0) {
    iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    pTVar6 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x58))();
    bVar2 = TQualifier::isFrontEndConstant(pTVar6);
    if (bVar2) {
      dotFeature = (char *)TIntermediate::foldSwizzle
                                     ((this->super_TParseContextBase).super_TParseVersions.
                                      intermediate,base,
                                      (TSwizzleSelectors<int> *)((long)&type.spirvType + 4),loc);
    }
    else {
      iVar4 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
      if (iVar4 == 1) {
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar4 = TSwizzleSelectors<int>::operator[]
                          ((TSwizzleSelectors<int> *)((long)&type.spirvType + 4),0);
        local_f8 = TIntermediate::addConstantUnion(this_00,iVar4,loc,false);
        dotFeature = (char *)TIntermediate::addIndex
                                       ((this->super_TParseContextBase).super_TParseVersions.
                                        intermediate,EOpIndexDirect,base,
                                        &local_f8->super_TIntermTyped,loc);
        TVar5 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])();
        iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x58))();
        TType::TType((TType *)&index_1,TVar5,EvqTemporary,
                     (TPrecisionQualifier)(*(ulong *)(lVar7 + 8) >> 0x19) & 7,1,0,0,false);
        (*(((TIntermTyped *)dotFeature)->super_TIntermNode)._vptr_TIntermNode[0x1d])
                  (dotFeature,&index_1);
        TType::~TType((TType *)&index_1);
      }
      else {
        local_198 = TIntermediate::addSwizzle<int>
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               (TSwizzleSelectors<int> *)((long)&type.spirvType + 4),loc);
        dotFeature = (char *)TIntermediate::addIndex
                                       ((this->super_TParseContextBase).super_TParseVersions.
                                        intermediate,EOpVectorSwizzle,base,local_198,loc);
        TVar5 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])();
        iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x58))();
        uVar1 = *(ulong *)(lVar7 + 8);
        iVar4 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
        TType::TType(&local_230,TVar5,EvqTemporary,(TPrecisionQualifier)(uVar1 >> 0x19) & 7,iVar4,0,
                     0,false);
        (*(((TIntermTyped *)dotFeature)->super_TIntermNode)._vptr_TIntermNode[0x1d])
                  (dotFeature,&local_230);
        TType::~TType(&local_230);
      }
      iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      pTVar6 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x58))();
      bVar2 = TQualifier::isSpecConstant(pTVar6);
      if (bVar2) {
        plVar8 = (long *)(**(code **)(*(long *)dotFeature + 0xf8))();
        pTVar6 = (TQualifier *)(**(code **)(*plVar8 + 0x50))();
        TQualifier::makeSpecConstant(pTVar6);
      }
    }
    this_local = (TParseContext *)dotFeature;
  }
  else {
    iVar4 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
    this_local = (TParseContext *)base;
    if (iVar4 != 1) {
      TVar5 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])();
      iVar4 = TSwizzleSelectors<int>::size((TSwizzleSelectors<int> *)((long)&type.spirvType + 4));
      TType::TType((TType *)&index,TVar5,EvqTemporary,iVar4,0,0,false);
      iVar4 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x21])();
      bVar2 = TQualifier::isSpecConstant((TQualifier *)CONCAT44(extraout_var_02,iVar4));
      if (bVar2) {
        pTVar6 = TType::getQualifier((TType *)&index);
        TQualifier::makeSpecConstant(pTVar6);
      }
      this_local = (TParseContext *)
                   addConstructor(this,loc,&base->super_TIntermNode,(TType *)&index);
      TType::~TType((TType *)&index);
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::handleDotSwizzle(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    TIntermTyped* result = base;
    if (base->isScalar()) {
        const char* dotFeature = "scalar swizzle";
        requireProfile(loc, ~EEsProfile, dotFeature);
        profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, dotFeature);
    }

    TSwizzleSelectors<TVectorSelector> selectors;
    parseSwizzleSelector(loc, field, base->getVectorSize(), selectors);

    if (base->isVector() && selectors.size() != 1 && base->getType().contains16BitFloat())
        requireFloat16Arithmetic(loc, ".", "can't swizzle types containing float16");
    if (base->isVector() && selectors.size() != 1 && base->getType().contains16BitInt())
        requireInt16Arithmetic(loc, ".", "can't swizzle types containing (u)int16");
    if (base->isVector() && selectors.size() != 1 && base->getType().contains8BitInt())
        requireInt8Arithmetic(loc, ".", "can't swizzle types containing (u)int8");

    if (base->isScalar()) {
        if (selectors.size() == 1)
            return result;
        else {
            TType type(base->getBasicType(), EvqTemporary, selectors.size());
            // Swizzle operations propagate specialization-constantness
            if (base->getQualifier().isSpecConstant())
                type.getQualifier().makeSpecConstant();
            return addConstructor(loc, base, type);
        }
    }

    if (base->getType().getQualifier().isFrontEndConstant())
        result = intermediate.foldSwizzle(base, selectors, loc);
    else {
        if (selectors.size() == 1) {
            TIntermTyped* index = intermediate.addConstantUnion(selectors[0], loc);
            result = intermediate.addIndex(EOpIndexDirect, base, index, loc);
            result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision));
        } else {
            TIntermTyped* index = intermediate.addSwizzle(selectors, loc);
            result = intermediate.addIndex(EOpVectorSwizzle, base, index, loc);
            result->setType(TType(base->getBasicType(), EvqTemporary, base->getType().getQualifier().precision, selectors.size()));
        }
        // Swizzle operations propagate specialization-constantness
        if (base->getType().getQualifier().isSpecConstant())
            result->getWritableType().getQualifier().makeSpecConstant();
    }

    return result;
}